

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_prepared.cpp
# Opt level: O3

void RecreateTable(Connection *con)

{
  SourceLineInfo *pSVar1;
  PreparedStatement *pPVar2;
  char cVar3;
  long lVar4;
  AssertionHandler catchAssertionHandler;
  StreamEndStop local_f9;
  long *local_f8;
  PreparedStatement *local_f0;
  SourceLineInfo local_e8;
  char local_d8 [16];
  ReusableStringStream local_c8;
  string local_b0;
  Connection *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  pSVar1 = &local_78.m_assertionInfo.lineInfo;
  lVar4 = 1000;
  local_90 = con;
  do {
    local_78.m_assertionInfo.macroName.m_start = (char *)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"create or replace table foo as select * from foo","");
    duckdb::Connection::Prepare((string *)&local_f0);
    if ((SourceLineInfo *)local_78.m_assertionInfo.macroName.m_start != pSVar1) {
      operator_delete(local_78.m_assertionInfo.macroName.m_start);
    }
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                *)&local_f0);
    duckdb::PreparedStatement::Execute<>((PreparedStatement *)&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_f8);
    cVar3 = duckdb::BaseQueryResult::HasError();
    if (cVar3 != '\0') {
      local_b0._M_dataplus._M_p = "FAIL";
      local_b0._M_string_length = 4;
      local_e8.file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_prepared.cpp"
      ;
      local_e8.line = 0x18;
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b0,&local_e8,(StringRef)ZEXT816(0x4fc2d7),Normal);
      local_c8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_c8.m_index = 0;
      local_c8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_c8);
      Catch::StreamEndStop::operator+[abi_cxx11_(&local_f9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c8.m_oss,local_e8.file,local_e8.line);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_b0,&local_c8);
      local_88.m_start = local_b0._M_dataplus._M_p;
      local_88.m_size = local_b0._M_string_length;
      Catch::AssertionHandler::handleMessage(&local_78,ExplicitFailure,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_e8.file != local_d8) {
        operator_delete(local_e8.file);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_c8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x11])
                  (local_78.m_resultCapture,&local_78);
      }
    }
    if (local_f8 != (long *)0x0) {
      (**(code **)(*local_f8 + 8))();
    }
    pPVar2 = local_f0;
    if (local_f0 != (PreparedStatement *)0x0) {
      duckdb::PreparedStatement::~PreparedStatement(local_f0);
      operator_delete(pPVar2);
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  return;
}

Assistant:

static void RecreateTable(Connection con) {
	for (idx_t i = 0; i < 1000; i++) {
		auto prepare = con.Prepare("create or replace table foo as select * from foo");
		auto result = prepare->Execute();
		if (result->HasError()) {
			FAIL();
		}
	}
}